

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

Error __thiscall
llvm::DWARFDebugLine::Prologue::parse
          (Prologue *this,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,DWARFContext *Ctx,
          DWARFUnit *U)

{
  size_t *psVar1;
  uint8_t *puVar2;
  Form Form;
  FormParams Params;
  undefined4 uVar3;
  iterator __position;
  iterator iVar4;
  iterator iVar5;
  DWARFUnitVector *pDVar6;
  undefined1 auVar7 [8];
  undefined8 uVar8;
  uint8_t uVar9;
  byte bVar10;
  bool bVar11;
  uint16_t uVar12;
  char *pcVar13;
  uint64_t uVar14;
  char acVar15 [8];
  ulong uVar16;
  uint uVar17;
  Prologue *pPVar18;
  DWARFUnit *in_R9;
  DWARFContext *pDVar19;
  AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
  AVar20;
  StringRef SVar21;
  OptionalStorage<unsigned_long,_true> OVar22;
  Optional<unsigned_long> OVar23;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  Optional<llvm::ArrayRef<unsigned_char>_> local_1e8;
  Optional<llvm::ArrayRef<unsigned_char>_> local_1d0;
  vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
  *local_1b8;
  undefined1 local_1b0 [8];
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> FileDescriptors;
  uint8_t OpLen;
  uint8_t *puStack_168;
  uint64_t uStack_160;
  DWARFUnit *local_158;
  DWARFContext *pDStack_150;
  undefined1 auStack_e8 [8];
  DWARFFormValue Value_1;
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> DirDescriptors;
  _func_int **local_70;
  uint64_t PrologueOffset;
  uint64_t EndPrologueOffset;
  _func_int **local_58;
  Prologue *local_50;
  DWARFUnit *local_48;
  uint local_40;
  uint local_3c;
  _Head_base<0UL,_llvm::DWARFDebugLoc_*,_false> local_38;
  Error e;
  
  local_70 = (Ctx->super_DIContext)._vptr_DIContext;
  DirDescriptors._48_8_ = U;
  local_50 = this;
  local_48 = in_R9;
  clear((Prologue *)DebugLineData);
  pcVar13 = (char *)DWARFDataExtractor::getRelocatedValue
                              ((DWARFDataExtractor *)OffsetPtr,4,(uint64_t *)Ctx,(uint64_t *)0x0,
                               (Error *)0x0);
  (DebugLineData->super_DataExtractor).Data.Data = pcVar13;
  if (pcVar13 == (char *)0xffffffff) {
    *(undefined1 *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 3) = 1;
    pcVar13 = (char *)DataExtractor::getU64((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0)
    ;
    (DebugLineData->super_DataExtractor).Data.Data = pcVar13;
  }
  else if (0xffffffe < (ulong)pcVar13 >> 4) {
    pcVar13 = (char *)std::_V2::generic_category();
    pPVar18 = local_50;
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = local_50;
    createStringError<unsigned_long,unsigned_long>
              (EC,pcVar13,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx unsupported reserved unit length found of value 0x%8.8lx"
               ,(unsigned_long *)&local_70);
    return (Error)(ErrorInfoBase *)pPVar18;
  }
  uVar12 = DataExtractor::getU16((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
  *(uint16_t *)&(DebugLineData->super_DataExtractor).Data.Length = uVar12;
  if (uVar12 < 2) {
    pcVar13 = (char *)std::_V2::generic_category();
    pPVar18 = local_50;
    FileDescriptors._48_2_ = uVar12;
    EC_00._M_cat = (error_category *)0x5f;
    EC_00._0_8_ = local_50;
    createStringError<unsigned_long,unsigned_short>
              (EC_00,pcVar13,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx found unsupported version 0x%2.2x",
               (unsigned_short *)&local_70);
  }
  else {
    if (4 < uVar12) {
      uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      *(uint8_t *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 2) = uVar9;
      if (*(uint8_t *)((long)OffsetPtr + 0x11) != '\0' &&
          *(uint8_t *)((long)OffsetPtr + 0x11) != uVar9) {
        __assert_fail("(DebugLineData.getAddressSize() == 0 || DebugLineData.getAddressSize() == getAddressSize()) && \"Line table header and data extractor disagree\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                      ,0x162,
                      "Error llvm::DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &, uint64_t *, const DWARFContext &, const DWARFUnit *)"
                     );
      }
      uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      *(uint8_t *)&DebugLineData->Obj = uVar9;
    }
    uVar14 = DWARFDataExtractor::getRelocatedValue
                       ((DWARFDataExtractor *)OffsetPtr,
                        (uint)(*(char *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 3
                                        ) == '\x01') * 4 + 4,(uint64_t *)Ctx,(uint64_t *)0x0,
                        (Error *)0x0);
    (DebugLineData->super_DataExtractor).IsLittleEndian = (char)uVar14;
    (DebugLineData->super_DataExtractor).AddressSize = (char)(uVar14 >> 8);
    *(int6 *)&(DebugLineData->super_DataExtractor).field_0x12 = (int6)(uVar14 >> 0x10);
    PrologueOffset = uVar14 + (long)(Ctx->super_DIContext)._vptr_DIContext;
    uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 1) = uVar9;
    if (3 < (ushort)(DebugLineData->super_DataExtractor).Data.Length) {
      uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
      *(uint8_t *)((long)&DebugLineData->Obj + 2) = uVar9;
    }
    uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 3) = uVar9;
    uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 4) = uVar9;
    uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 5) = uVar9;
    bVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
    *(byte *)((long)&DebugLineData->Obj + 6) = bVar10;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(DebugLineData + 1),
               (ulong)bVar10 - 1);
    if (1 < *(byte *)((long)&DebugLineData->Obj + 6)) {
      uVar17 = 1;
      do {
        uVar9 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
        FileDescriptors._48_1_ = uVar9;
        __position._M_current = (uchar *)DebugLineData[1].super_DataExtractor.Data.Length;
        if (__position._M_current == *(uchar **)&DebugLineData[1].super_DataExtractor.IsLittleEndian
           ) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)(DebugLineData + 1),
                     __position,&FileDescriptors.field_0x30);
        }
        else {
          *__position._M_current = uVar9;
          psVar1 = &DebugLineData[1].super_DataExtractor.Data.Length;
          *psVar1 = *psVar1 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < *(byte *)((long)&DebugLineData->Obj + 6));
    }
    uVar14 = PrologueOffset;
    if ((ushort)(DebugLineData->super_DataExtractor).Data.Length < 5) {
      if ((Ctx->super_DIContext)._vptr_DIContext < PrologueOffset) {
        local_48 = (DWARFUnit *)&DebugLineData[1].Obj;
        do {
          SVar21 = DataExtractor::getCStrRef((DataExtractor *)OffsetPtr,(uint64_t *)Ctx);
          if (SVar21.Length == 0) break;
          DWARFFormValue::createFromPValue(DW_FORM_string,SVar21.Data);
          iVar4._M_current = (DWARFFormValue *)DebugLineData[1].Section;
          if (iVar4._M_current == (DWARFFormValue *)DebugLineData[2].super_DataExtractor.Data.Data)
          {
            std::vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>>::
            _M_realloc_insert<llvm::DWARFFormValue_const&>
                      ((vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>> *)local_48
                       ,iVar4,(DWARFFormValue *)&FileDescriptors.field_0x30);
          }
          else {
            (iVar4._M_current)->U = local_158;
            (iVar4._M_current)->C = pDStack_150;
            ((iVar4._M_current)->Value).data = puStack_168;
            ((iVar4._M_current)->Value).SectionIndex = uStack_160;
            (iVar4._M_current)->Form = FileDescriptors._48_2_;
            *(undefined6 *)&(iVar4._M_current)->field_0x2 = FileDescriptors._50_6_;
            ((iVar4._M_current)->Value).field_0 = _OpLen;
            DebugLineData[1].Section = DebugLineData[1].Section + 3;
          }
        } while ((Ctx->super_DIContext)._vptr_DIContext < uVar14);
      }
      if ((Ctx->super_DIContext)._vptr_DIContext < uVar14) {
        local_48 = (DWARFUnit *)&DebugLineData[2].super_DataExtractor.Data.Length;
        do {
          SVar21 = DataExtractor::getCStrRef((DataExtractor *)OffsetPtr,(uint64_t *)Ctx);
          if (SVar21.Length == 0) break;
          FileDescriptors._48_8_ = FileDescriptors._48_8_ & 0xffffffffffff0000;
          DWARFFormValue::createFromPValue(DW_FORM_string,SVar21.Data);
          FileDescriptors._48_8_ = Value_1.C;
          DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          DataExtractor::getULEB128((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          iVar5._M_current = *(FileNameEntry **)&DebugLineData[2].super_DataExtractor.IsLittleEndian
          ;
          if (iVar5._M_current == (FileNameEntry *)DebugLineData[2].Obj) {
            std::
            vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
            ::_M_realloc_insert<llvm::DWARFDebugLine::FileNameEntry_const&>
                      ((vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
                        *)local_48,iVar5,(FileNameEntry *)&FileDescriptors.field_0x30);
          }
          else {
            memcpy(iVar5._M_current,&FileDescriptors.field_0x30,0x88);
            puVar2 = &DebugLineData[2].super_DataExtractor.IsLittleEndian;
            *(long *)puVar2 = *(long *)puVar2 + 0x88;
          }
        } while ((Ctx->super_DIContext)._vptr_DIContext < uVar14);
      }
      *(undefined2 *)((long)&DebugLineData->Obj + 7) = 0x101;
    }
    else {
      local_58 = (_func_int **)PrologueOffset;
      parseV5EntryFormat((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                          *)&Value_1.C,(DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,
                         PrologueOffset,(ContentTypeTracker *)0x0);
      pDVar19 = Value_1.C;
      if ((DirDescriptors.field_0.TStorage.buffer[0x28] & 1U) == 0) {
        bVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
        if (bVar10 != 0) {
          local_3c = (uint)bVar10;
          uVar17 = 0;
          do {
            if (local_58 <= (Ctx->super_DIContext)._vptr_DIContext) {
              pcVar13 = (char *)std::_V2::generic_category();
              EC_03._M_cat = (error_category *)0x16;
              EC_03._0_8_ = &local_38;
              createStringError<unsigned_long,unsigned_long>
                        (EC_03,pcVar13,
                         (unsigned_long *)
                         "failed to parse directory entry at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                         ,(unsigned_long *)Ctx);
              goto LAB_00afed2f;
            }
            local_40 = uVar17;
            if ((DirDescriptors.field_0.TStorage.buffer[0x28] & 1U) != 0) goto LAB_00afeec7;
            uVar16 = (ulong)(uint)DirDescriptors.field_0._0_4_;
            if (uVar16 != 0) {
              pDVar6 = &(Value_1.C)->NormalUnits;
              pDVar19 = Value_1.C;
              do {
                Form = *(Form *)((long)&(pDVar19->super_DIContext)._vptr_DIContext + 4);
                FileDescriptors._48_2_ = Form;
                Params = *(FormParams *)&(DebugLineData->super_DataExtractor).Data.Length;
                if (*(int *)&(pDVar19->super_DIContext)._vptr_DIContext == 1) {
                  bVar11 = DWARFFormValue::extractValue
                                     ((DWARFFormValue *)&FileDescriptors.field_0x30,
                                      (DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,Params,
                                      (DWARFContext *)DirDescriptors._48_8_,local_48);
                  uVar8 = FileDescriptors._48_8_;
                  if (!bVar11) {
LAB_00afe9dd:
                    pcVar13 = (char *)std::_V2::generic_category();
                    EC_01._M_cat = (error_category *)0x16;
                    EC_01._0_8_ = &local_38;
                    createStringError(EC_01,pcVar13);
                    goto LAB_00afed2f;
                  }
                  iVar4._M_current = (DWARFFormValue *)DebugLineData[1].Section;
                  if (iVar4._M_current ==
                      (DWARFFormValue *)DebugLineData[2].super_DataExtractor.Data.Data) {
                    std::vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>>::
                    _M_realloc_insert<llvm::DWARFFormValue_const&>
                              ((vector<llvm::DWARFFormValue,std::allocator<llvm::DWARFFormValue>> *)
                               &DebugLineData[1].Obj,iVar4,
                               (DWARFFormValue *)&FileDescriptors.field_0x30);
                  }
                  else {
                    (iVar4._M_current)->U = (DWARFUnit *)0x0;
                    (iVar4._M_current)->C = (DWARFContext *)0x0;
                    ((iVar4._M_current)->Value).data = (uint8_t *)0x0;
                    ((iVar4._M_current)->Value).SectionIndex = uStack_160;
                    (iVar4._M_current)->Form = FileDescriptors._48_2_;
                    *(undefined2 *)&(iVar4._M_current)->field_0x2 = FileDescriptors._50_2_;
                    *(undefined4 *)&(iVar4._M_current)->field_0x4 = FileDescriptors._52_4_;
                    *(undefined4 *)&((iVar4._M_current)->Value).field_0 = 0;
                    *(undefined4 *)((long)&((iVar4._M_current)->Value).field_0 + 4) = 0;
                    DebugLineData[1].Section = DebugLineData[1].Section + 3;
                    FileDescriptors._48_8_ = uVar8;
                  }
                }
                else {
                  bVar11 = DWARFFormValue::skipValue
                                     (Form,*(DataExtractor *)OffsetPtr,(uint64_t *)Ctx,Params);
                  if (!bVar11) goto LAB_00afe9dd;
                }
                pDVar19 = (DWARFContext *)&(pDVar19->super_DIContext).Kind;
              } while (pDVar19 !=
                       (DWARFContext *)
                       (&(pDVar6->
                         super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                         ).
                         super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                       + (uVar16 - 4)));
            }
            uVar17 = local_40 + 1;
          } while (uVar17 != local_3c);
        }
        parseV5EntryFormat((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                            *)local_1b0,(DWARFDataExtractor *)OffsetPtr,(uint64_t *)Ctx,
                           (uint64_t)local_58,(ContentTypeTracker *)((long)&DebugLineData->Obj + 7))
        ;
        auVar7 = local_1b0;
        if ((FileDescriptors.field_0.TStorage.buffer[0x28] & 1U) == 0) {
          bVar10 = DataExtractor::getU8((DataExtractor *)OffsetPtr,(uint64_t *)Ctx,(Error *)0x0);
          if (bVar10 != 0) {
            local_1b8 = (vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
                         *)&DebugLineData[2].super_DataExtractor.Data.Length;
            local_3c = (uint)bVar10;
            uVar17 = 0;
            do {
              if (local_58 <= (Ctx->super_DIContext)._vptr_DIContext) {
                pcVar13 = (char *)std::_V2::generic_category();
                EC_06._M_cat = (error_category *)0x16;
                EC_06._0_8_ = &local_38;
                createStringError<unsigned_long,unsigned_long>
                          (EC_06,pcVar13,
                           (unsigned_long *)
                           "failed to parse file entry at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                           ,(unsigned_long *)Ctx);
                goto LAB_00afecd0;
              }
              FileDescriptors._48_8_ = FileDescriptors._48_8_ & 0xffffffffffff0000;
              local_40 = uVar17;
              if ((FileDescriptors.field_0.TStorage.buffer[0x28] & 1U) != 0) {
LAB_00afeec7:
                __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                              ,0x272,
                              "storage_type *llvm::Expected<llvm::SmallVector<(anonymous namespace)::ContentDescriptor, 4>>::getStorage() [T = llvm::SmallVector<(anonymous namespace)::ContentDescriptor, 4>]"
                             );
              }
              bVar11 = (ulong)(uint)FileDescriptors.field_0._0_4_ == 0;
              if (!bVar11) {
                acVar15 = (char  [8])
                          ((ulong)(uint)FileDescriptors.field_0._0_4_ * 8 + (long)local_1b0);
                AVar20.buffer = (char  [8])local_1b0;
                do {
                  uVar3 = *(undefined4 *)AVar20.buffer;
                  auStack_e8._0_2_ = *(Form *)((long)AVar20.buffer + 4);
                  Value_1.Form = 0;
                  Value_1._2_6_ = 0;
                  Value_1.Value.field_0.uval = 0;
                  Value_1.Value.SectionIndex = 0;
                  Value_1.U = (DWARFUnit *)0x0;
                  bVar11 = DWARFFormValue::extractValue
                                     ((DWARFFormValue *)auStack_e8,(DWARFDataExtractor *)OffsetPtr,
                                      (uint64_t *)Ctx,
                                      *(FormParams *)
                                       &(DebugLineData->super_DataExtractor).Data.Length,
                                      (DWARFContext *)DirDescriptors._48_8_,local_48);
                  if (!bVar11) {
LAB_00afecb7:
                    pcVar13 = (char *)std::_V2::generic_category();
                    EC_02._M_cat = (error_category *)0x16;
                    EC_02._0_8_ = &local_38;
                    createStringError(EC_02,pcVar13);
                    goto LAB_00afecd0;
                  }
                  switch(uVar3) {
                  case 1:
                    FileDescriptors._50_6_ = auStack_e8._2_6_;
                    FileDescriptors._48_2_ = auStack_e8._0_2_;
                    break;
                  case 2:
                    OVar23 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_e8);
                    if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) !=
                        (undefined1  [16])0x0) break;
                    goto LAB_00afeee6;
                  case 3:
                    OVar22 = (OptionalStorage<unsigned_long,_true>)
                             DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_e8);
                    goto joined_r0x00afec1d;
                  case 4:
                    OVar22 = (OptionalStorage<unsigned_long,_true>)
                             DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)auStack_e8);
joined_r0x00afec1d:
                    if (((undefined1  [16])OVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                    {
LAB_00afeee6:
                      pcVar13 = 
                      "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                      ;
LAB_00afef12:
                      __assert_fail("hasVal",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                                    ,0xad,pcVar13);
                    }
                    break;
                  case 5:
                    DWARFFormValue::getAsBlock(&local_1d0,(DWARFFormValue *)auStack_e8);
                    if (local_1d0.Storage.hasVal == true) {
                      DWARFFormValue::getAsBlock(&local_1e8,(DWARFFormValue *)auStack_e8);
                      if (local_1e8.Storage.hasVal != false) {
                        if (local_1e8.Storage.field_0.value.Length != 0x10) goto LAB_00afecb7;
                        DWARFFormValue::getAsBlock(&local_1d0,(DWARFFormValue *)auStack_e8);
                        if (local_1d0.Storage.hasVal != false) break;
                      }
                      pcVar13 = 
                      "T &llvm::optional_detail::OptionalStorage<llvm::ArrayRef<unsigned char>>::getValue() & [T = llvm::ArrayRef<unsigned char>]"
                      ;
                      goto LAB_00afef12;
                    }
                    goto LAB_00afecb7;
                  default:
                  }
                  AVar20.buffer = AVar20.buffer + 8;
                  bVar11 = AVar20.buffer == acVar15;
                } while (!bVar11);
              }
              iVar5._M_current =
                   *(FileNameEntry **)&DebugLineData[2].super_DataExtractor.IsLittleEndian;
              if (iVar5._M_current == (FileNameEntry *)DebugLineData[2].Obj) {
                std::
                vector<llvm::DWARFDebugLine::FileNameEntry,std::allocator<llvm::DWARFDebugLine::FileNameEntry>>
                ::_M_realloc_insert<llvm::DWARFDebugLine::FileNameEntry_const&>
                          (local_1b8,iVar5,(FileNameEntry *)&FileDescriptors.field_0x30);
              }
              else {
                memcpy(iVar5._M_current,&FileDescriptors.field_0x30,0x88);
                puVar2 = &DebugLineData[2].super_DataExtractor.IsLittleEndian;
                *(long *)puVar2 = *(long *)puVar2 + 0x88;
              }
              if (!bVar11) goto LAB_00afecd0;
              uVar17 = local_40 + 1;
            } while (uVar17 != local_3c);
          }
          local_38._M_head_impl = (DWARFDebugLoc *)0x1;
        }
        else {
          local_1b0[0] = '\0';
          local_1b0[1] = '\0';
          local_1b0[2] = '\0';
          local_1b0[3] = '\0';
          local_1b0[4] = '\0';
          local_1b0[5] = '\0';
          local_1b0[6] = '\0';
          local_1b0[7] = '\0';
          local_38._M_head_impl = (DWARFDebugLoc *)((ulong)auVar7 | 1);
        }
LAB_00afecd0:
        if ((FileDescriptors.field_0.TStorage.buffer[0x28] & 1U) == 0) {
          if (local_1b0 != (undefined1  [8])((long)&FileDescriptors.field_0 + 8)) {
            free((void *)local_1b0);
          }
        }
        else {
          if ((char  [8])local_1b0 != (char  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
          local_1b0[0] = '\0';
          local_1b0[1] = '\0';
          local_1b0[2] = '\0';
          local_1b0[3] = '\0';
          local_1b0[4] = '\0';
          local_1b0[5] = '\0';
          local_1b0[6] = '\0';
          local_1b0[7] = '\0';
        }
      }
      else {
        Value_1.C = (DWARFContext *)0x0;
        local_38._M_head_impl = (DWARFDebugLoc *)((ulong)pDVar19 | 1);
      }
LAB_00afed2f:
      if ((DirDescriptors.field_0.TStorage.buffer[0x28] & 1U) == 0) {
        if (Value_1.C != (DWARFContext *)((long)&DirDescriptors.field_0 + 8)) {
          free(Value_1.C);
        }
      }
      else {
        if (Value_1.C != (DWARFContext *)0x0) {
          (*((Value_1.C)->super_DIContext)._vptr_DIContext[1])();
        }
        Value_1.C = (DWARFContext *)0x0;
      }
      uVar16 = (ulong)local_38._M_head_impl & 0xfffffffffffffffe;
      local_38._M_head_impl = (DWARFDebugLoc *)(uVar16 != 0 | uVar16);
      if (uVar16 != 0) {
        pcVar13 = (char *)std::_V2::generic_category();
        EC_04._M_cat = (error_category *)0x16;
        EC_04._0_8_ = &EndPrologueOffset;
        createStringError<unsigned_long,unsigned_long>
                  (EC_04,pcVar13,
                   (unsigned_long *)
                   "parsing line table prologue at 0x%8.8lx found an invalid directory or file table description at 0x%8.8lx"
                   ,(unsigned_long *)&local_70);
        pPVar18 = local_50;
        local_1b0 = (undefined1  [8])((ulong)local_38._M_head_impl | 1);
        local_38._M_head_impl = (DWARFDebugLoc *)0x0;
        Value_1.C = (DWARFContext *)(EndPrologueOffset | 1);
        EndPrologueOffset = 0;
        ErrorList::join((ErrorList *)local_50,(Error *)&Value_1.C,(Error *)local_1b0);
        if ((long *)((ulong)local_1b0 & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_1b0 & 0xfffffffffffffffe) + 8))();
        }
        if ((long *)((ulong)Value_1.C & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)Value_1.C & 0xfffffffffffffffe) + 8))();
        }
        if ((long *)(EndPrologueOffset & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(EndPrologueOffset & 0xfffffffffffffffe) + 8))();
        }
        if ((long *)((ulong)local_38._M_head_impl & 0xfffffffffffffffe) == (long *)0x0) {
          return (Error)(ErrorInfoBase *)pPVar18;
        }
        (**(code **)(*(long *)((ulong)local_38._M_head_impl & 0xfffffffffffffffe) + 8))();
        return (Error)(ErrorInfoBase *)pPVar18;
      }
    }
    if ((Ctx->super_DIContext)._vptr_DIContext == (_func_int **)PrologueOffset) {
      local_50->TotalLength = 1;
      pPVar18 = local_50;
    }
    else {
      pcVar13 = (char *)std::_V2::generic_category();
      pPVar18 = local_50;
      EC_05._M_cat = (error_category *)0x16;
      EC_05._0_8_ = local_50;
      createStringError<unsigned_long,unsigned_long,unsigned_long>
                (EC_05,pcVar13,
                 (unsigned_long *)
                 "parsing line table prologue at 0x%8.8lx should have ended at 0x%8.8lx but it ended at 0x%8.8lx"
                 ,(unsigned_long *)&local_70,&PrologueOffset);
    }
  }
  return (Error)(ErrorInfoBase *)pPVar18;
}

Assistant:

Error DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &DebugLineData,
                                      uint64_t *OffsetPtr,
                                      const DWARFContext &Ctx,
                                      const DWARFUnit *U) {
  const uint64_t PrologueOffset = *OffsetPtr;

  clear();
  TotalLength = DebugLineData.getRelocatedValue(4, OffsetPtr);
  if (TotalLength == dwarf::DW_LENGTH_DWARF64) {
    FormParams.Format = dwarf::DWARF64;
    TotalLength = DebugLineData.getU64(OffsetPtr);
  } else if (TotalLength >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "parsing line table prologue at offset 0x%8.8" PRIx64
        " unsupported reserved unit length found of value 0x%8.8" PRIx64,
        PrologueOffset, TotalLength);
  }
  FormParams.Version = DebugLineData.getU16(OffsetPtr);
  if (getVersion() < 2)
    return createStringError(errc::not_supported,
                       "parsing line table prologue at offset 0x%8.8" PRIx64
                       " found unsupported version 0x%2.2" PRIx16,
                       PrologueOffset, getVersion());

  if (getVersion() >= 5) {
    FormParams.AddrSize = DebugLineData.getU8(OffsetPtr);
    assert((DebugLineData.getAddressSize() == 0 ||
            DebugLineData.getAddressSize() == getAddressSize()) &&
           "Line table header and data extractor disagree");
    SegSelectorSize = DebugLineData.getU8(OffsetPtr);
  }

  PrologueLength =
      DebugLineData.getRelocatedValue(sizeofPrologueLength(), OffsetPtr);
  const uint64_t EndPrologueOffset = PrologueLength + *OffsetPtr;
  MinInstLength = DebugLineData.getU8(OffsetPtr);
  if (getVersion() >= 4)
    MaxOpsPerInst = DebugLineData.getU8(OffsetPtr);
  DefaultIsStmt = DebugLineData.getU8(OffsetPtr);
  LineBase = DebugLineData.getU8(OffsetPtr);
  LineRange = DebugLineData.getU8(OffsetPtr);
  OpcodeBase = DebugLineData.getU8(OffsetPtr);

  StandardOpcodeLengths.reserve(OpcodeBase - 1);
  for (uint32_t I = 1; I < OpcodeBase; ++I) {
    uint8_t OpLen = DebugLineData.getU8(OffsetPtr);
    StandardOpcodeLengths.push_back(OpLen);
  }

  if (getVersion() >= 5) {
    if (Error e = parseV5DirFileTables(
            DebugLineData, OffsetPtr, EndPrologueOffset, FormParams, Ctx, U,
            ContentTypes, IncludeDirectories, FileNames)) {
      return joinErrors(
          createStringError(
              errc::invalid_argument,
              "parsing line table prologue at 0x%8.8" PRIx64
              " found an invalid directory or file table description at"
              " 0x%8.8" PRIx64,
              PrologueOffset, *OffsetPtr),
          std::move(e));
    }
  } else
    parseV2DirFileTables(DebugLineData, OffsetPtr, EndPrologueOffset,
                         ContentTypes, IncludeDirectories, FileNames);

  if (*OffsetPtr != EndPrologueOffset)
    return createStringError(errc::invalid_argument,
                       "parsing line table prologue at 0x%8.8" PRIx64
                       " should have ended at 0x%8.8" PRIx64
                       " but it ended at 0x%8.8" PRIx64,
                       PrologueOffset, EndPrologueOffset, *OffsetPtr);
  return Error::success();
}